

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::AudioTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               AudioTrack **pResult)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Segment *pSegment_00;
  long *in_RSI;
  long *in_R8;
  int status;
  AudioTrack *pTrack;
  long status_1;
  longlong size;
  longlong id;
  longlong bit_depth;
  longlong channels;
  double rate;
  longlong stop;
  longlong pos;
  Settings *s;
  IMkvReader *pReader;
  longlong in_stack_ffffffffffffff38;
  longlong in_stack_ffffffffffffff40;
  longlong *in_stack_ffffffffffffff48;
  longlong *in_stack_ffffffffffffff50;
  Segment *dst;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  double *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  longlong in_stack_ffffffffffffff70;
  IMkvReader *in_stack_ffffffffffffff78;
  long local_78;
  long local_70;
  longlong local_68;
  IMkvReader *local_60;
  long local_48;
  long local_8;
  
  if (*in_R8 == 0) {
    if (*in_RSI == 2) {
      local_48 = in_RSI[0xd];
      lVar2 = local_48 + in_RSI[0xe];
      local_60 = (IMkvReader *)0x1;
      local_68 = 0;
      do {
        if (lVar2 <= local_48) {
          if (local_48 != lVar2) {
            return -2;
          }
          pSegment_00 = (Segment *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
          dst = (Segment *)0x0;
          if (pSegment_00 != (Segment *)0x0) {
            AudioTrack((AudioTrack *)0x0,pSegment_00,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff38);
            dst = pSegment_00;
          }
          if (dst == (Segment *)0x0) {
            return -1;
          }
          iVar1 = Track::Info::Copy((Info *)CONCAT44(in_stack_ffffffffffffff5c,
                                                     in_stack_ffffffffffffff58),(Info *)dst);
          if (iVar1 != 0) {
            if (dst != (Segment *)0x0) {
              (*(code *)dst->m_pReader[1]._vptr_IMkvReader)();
            }
            return (long)iVar1;
          }
          dst->m_clusterSize = 0x40bf400000000000;
          dst[1].m_pReader = local_60;
          dst[1].m_element_start = local_68;
          *in_R8 = (long)dst;
          return 0;
        }
        lVar3 = ParseElementHeader((IMkvReader *)
                                   CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                                   (longlong *)in_stack_ffffffffffffff60,
                                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if (lVar3 < 0) {
          return lVar3;
        }
        if (local_70 == 0xb5) {
          lVar3 = UnserializeFloat(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                   CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                                   in_stack_ffffffffffffff60);
          if (lVar3 < 0) {
            return lVar3;
          }
        }
        else if (local_70 == 0x9f) {
          local_60 = (IMkvReader *)
                     UnserializeUInt((IMkvReader *)
                                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                                     (longlong)in_stack_ffffffffffffff60,
                                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          if ((long)local_60 < 1) {
            return -2;
          }
        }
        else if ((local_70 == 0x6264) &&
                (local_68 = UnserializeUInt((IMkvReader *)
                                            CONCAT17(in_stack_ffffffffffffff6f,
                                                     in_stack_ffffffffffffff68),
                                            (longlong)in_stack_ffffffffffffff60,
                                            CONCAT44(in_stack_ffffffffffffff5c,
                                                     in_stack_ffffffffffffff58)), local_68 < 1)) {
          return -2;
        }
        local_48 = local_78 + local_48;
      } while (local_48 <= lVar2);
      local_8 = -2;
    }
    else {
      local_8 = -1;
    }
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

long AudioTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       AudioTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kAudio)
    return -1;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  double rate = 8000.0;  // MKV default
  long long channels = 1;
  long long bit_depth = 0;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSamplingFrequency) {
      status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvChannels) {
      channels = UnserializeUInt(pReader, pos, size);

      if (channels <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvBitDepth) {
      bit_depth = UnserializeUInt(pReader, pos, size);

      if (bit_depth <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  AudioTrack* const pTrack =
      new (std::nothrow) AudioTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {
    delete pTrack;
    return status;
  }

  pTrack->m_rate = rate;
  pTrack->m_channels = channels;
  pTrack->m_bitDepth = bit_depth;

  pResult = pTrack;
  return 0;  // success
}